

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void sdl_audio_callback(void *client,uint8_t *stream,int len)

{
  size_t sVar1;
  size_t read;
  int available;
  float latency;
  int len_local;
  uint8_t *stream_local;
  void *client_local;
  
  sVar1 = ring_buf_available(&audio_ring_buf);
  latency_avg = latency_avg * 0.9 + ((float)(sVar1 >> 1) / 44100.0) * 1000.0 * 0.1;
  sVar1 = ring_buf_available(&audio_ring_buf);
  if ((int)sVar1 < len) {
    memset(stream,0,(long)len);
  }
  else {
    sVar1 = ring_buf_read(&audio_ring_buf,stream,(long)len);
    if (sVar1 < (ulong)(long)len) {
      memset(stream + sVar1,0,(long)len - sVar1);
    }
  }
  return;
}

Assistant:

void sdl_audio_callback(void* client, uint8_t* stream, int len)
{
    float latency = ((ring_buf_available(&audio_ring_buf) >> 1) / (float)SAMPLE_RATE) * 1000.0f;
    latency_avg = (latency_avg * 0.9f + latency * 0.1f);

    //printf("read latency: %.2f ms  avg: %.2f ms\n", latency, latency_avg);

    int available = (int)ring_buf_available(&audio_ring_buf);
    if (available >= len)
    {
        size_t read = ring_buf_read(&audio_ring_buf, stream, len);
        if (read < len)
            memset(stream + read, 0, len - read);
    }
    else
    {
        memset(stream, 0, len);
    }
}